

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsVarDeserializerReadValue(JsVarDeserializerHandle deserializerHandle,JsValueRef *value)

{
  anon_class_16_2_34324e01 fn;
  JsValueRef *local_20;
  JsValueRef *value_local;
  JsVarDeserializerHandle deserializerHandle_local;
  
  if (deserializerHandle == (JsVarDeserializerHandle)0x0) {
    deserializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else if (value == (JsValueRef *)0x0) {
    deserializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.value = &local_20;
    fn.deserializerHandle = &value_local;
    local_20 = value;
    value_local = (JsValueRef *)deserializerHandle;
    deserializerHandle_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsVarDeserializerReadValue::__0>(fn,false,false);
  }
  return deserializerHandle_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarDeserializerReadValue(_In_ JsVarDeserializerHandle deserializerHandle, _Out_ JsValueRef* value)
{
    PARAM_NOT_NULL(deserializerHandle);
    PARAM_NOT_NULL(value);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraHostDeserializerHandle* deserializer = reinterpret_cast<ChakraHostDeserializerHandle*>(deserializerHandle);
        *value = deserializer->ReadValue();
        return JsNoError;
    });
}